

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_arrow_collector.cpp
# Opt level: O2

unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>,_true>
 __thiscall
duckdb::PhysicalArrowCollector::Create
          (PhysicalArrowCollector *this,ClientContext *context,PreparedStatementData *data,
          idx_t batch_size)

{
  bool bVar1;
  pointer pPVar2;
  PhysicalOperator *pPVar3;
  bool *args_1;
  bool local_2a;
  bool local_29;
  idx_t local_28;
  
  local_28 = batch_size;
  pPVar2 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
           operator->(&data->physical_plan);
  pPVar3 = optional_ptr<duckdb::PhysicalOperator,_true>::operator*(&pPVar2->root);
  bVar1 = PhysicalPlanGenerator::PreserveInsertionOrder(context,pPVar3);
  if (bVar1) {
    pPVar2 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
             operator->(&data->physical_plan);
    pPVar3 = optional_ptr<duckdb::PhysicalOperator,_true>::operator*(&pPVar2->root);
    bVar1 = PhysicalPlanGenerator::UseBatchIndex(context,pPVar3);
    if (bVar1) {
      make_uniq_base<duckdb::PhysicalResultCollector,duckdb::PhysicalArrowBatchCollector,duckdb::PreparedStatementData&,unsigned_long&>
                ((duckdb *)this,data,&local_28);
      return (unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>_>
              )(unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>_>
                )this;
    }
    args_1 = &local_2a;
    local_2a = false;
  }
  else {
    args_1 = &local_29;
    local_29 = true;
  }
  make_uniq_base<duckdb::PhysicalResultCollector,duckdb::PhysicalArrowCollector,duckdb::PreparedStatementData&,bool,unsigned_long&>
            ((duckdb *)this,data,args_1,&local_28);
  return (unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>_>
          )(unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>_>
            )this;
}

Assistant:

unique_ptr<PhysicalResultCollector> PhysicalArrowCollector::Create(ClientContext &context, PreparedStatementData &data,
                                                                   idx_t batch_size) {
	if (!PhysicalPlanGenerator::PreserveInsertionOrder(context, data.physical_plan->Root())) {
		// the plan is not order preserving, so we just use the parallel materialized collector
		return make_uniq_base<PhysicalResultCollector, PhysicalArrowCollector>(data, true, batch_size);
	} else if (!PhysicalPlanGenerator::UseBatchIndex(context, data.physical_plan->Root())) {
		// the plan is order preserving, but we cannot use the batch index: use a single-threaded result collector
		return make_uniq_base<PhysicalResultCollector, PhysicalArrowCollector>(data, false, batch_size);
	} else {
		return make_uniq_base<PhysicalResultCollector, PhysicalArrowBatchCollector>(data, batch_size);
	}
}